

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

void __thiscall Matrix2f::Matrix2f(Matrix2f *this,Vector2f *v0,Vector2f *v1,bool setColumns)

{
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,setColumns) != 0) {
    setCol(this,0,v0);
    setCol(this,1,v1);
    return;
  }
  setRow(this,0,v0);
  setRow(this,1,v1);
  return;
}

Assistant:

Matrix2f::Matrix2f( const Vector2f& v0, const Vector2f& v1, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
	}
}